

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O2

RefcountedTemplate * __thiscall
ctemplate::TemplateCache::GetTemplateLocked
          (TemplateCache *this,TemplateString *filename,Strip strip,
          TemplateCacheKey *template_cache_key)

{
  bool bVar1;
  TemplateState TVar2;
  second_type *psVar3;
  Template *pTVar4;
  char *pcVar5;
  time_t mtime;
  pair<unsigned_long,_int> v;
  CachedTemplate local_100;
  string resolved;
  FileStat statbuf;
  
  v.first = (ulong)(uint)template_cache_key->second;
  v._8_8_ = template_cache_key;
  psVar3 = find_ptr<std::unordered_map<std::pair<unsigned_long,int>,ctemplate::TemplateCache::CachedTemplate,ctemplate::TemplateCache::TemplateCacheHash,std::equal_to<std::pair<unsigned_long,int>>,std::allocator<std::pair<std::pair<unsigned_long,int>const,ctemplate::TemplateCache::CachedTemplate>>>,std::pair<unsigned_long,int>>
                     ((ctemplate *)this->parsed_template_cache_,
                      (unordered_map<std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate,_ctemplate::TemplateCache::TemplateCacheHash,_std::equal_to<std::pair<unsigned_long,_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>_>
                       *)template_cache_key->first,v);
  if (psVar3 == (second_type *)0x0) {
    if (this->is_frozen_ != false) {
      return (RefcountedTemplate *)0x0;
    }
    pTVar4 = (Template *)operator_new(0xc0);
    Template::Template(pTVar4,filename,strip,this);
    psVar3 = std::__detail::
             _Map_base<std::pair<unsigned_long,_int>,_std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_int>_>,_ctemplate::TemplateCache::TemplateCacheHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::pair<unsigned_long,_int>,_std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_int>_>,_ctemplate::TemplateCache::TemplateCacheHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this->parsed_template_cache_,template_cache_key);
    CachedTemplate::CachedTemplate((CachedTemplate *)&statbuf,pTVar4,FILE_BASED);
    psVar3->refcounted_tpl = (RefcountedTemplate *)statbuf.mtime;
    psVar3->should_reload = (bool)(undefined1)statbuf.length;
    *(undefined3 *)&psVar3->field_0x9 = statbuf.length._1_3_;
    psVar3->template_type = statbuf.length._4_4_;
  }
  if (psVar3->should_reload != true) goto LAB_00126532;
  pcVar5 = Template::original_filename(psVar3->refcounted_tpl->ptr_);
  std::__cxx11::string::string((string *)&statbuf,pcVar5,(allocator *)&local_100);
  FindTemplateFilename(&resolved,this,(string *)&statbuf);
  std::__cxx11::string::~string((string *)&statbuf);
  if (psVar3->template_type == FILE_BASED) {
    pcVar5 = Template::template_file(psVar3->refcounted_tpl->ptr_);
    bVar1 = std::operator!=(&resolved,pcVar5);
    if (!bVar1) {
      pcVar5 = Template::template_file(psVar3->refcounted_tpl->ptr_);
      mtime = Template::mtime(psVar3->refcounted_tpl->ptr_);
      bVar1 = HasTemplateChangedOnDisk(pcVar5,mtime,&statbuf);
      if (!bVar1) goto LAB_00126524;
    }
    pTVar4 = (Template *)operator_new(0xc0);
    Template::Template(pTVar4,filename,strip,this);
    RefcountedTemplate::DecRef(psVar3->refcounted_tpl);
    CachedTemplate::CachedTemplate(&local_100,pTVar4,FILE_BASED);
    psVar3->refcounted_tpl = local_100.refcounted_tpl;
    psVar3->should_reload = local_100.should_reload;
    *(undefined3 *)&psVar3->field_0x9 = local_100._9_3_;
    psVar3->template_type = local_100.template_type;
  }
LAB_00126524:
  psVar3->should_reload = false;
  std::__cxx11::string::~string((string *)&resolved);
LAB_00126532:
  TVar2 = Template::state(psVar3->refcounted_tpl->ptr_);
  if (TVar2 != TS_READY) {
    return (RefcountedTemplate *)0x0;
  }
  return psVar3->refcounted_tpl;
}

Assistant:

TemplateCache::RefcountedTemplate* TemplateCache::GetTemplateLocked(
    const TemplateString& filename,
    Strip strip,
    const TemplateCacheKey& template_cache_key) {
  // NOTE: A write-lock must be held on mutex_ when this method is called.
  CachedTemplate* it = find_ptr(*parsed_template_cache_, template_cache_key);
  if (!it) {
    // If the cache is frozen and the template doesn't already exist in cache,
    // do not load the template, return NULL.
    if (is_frozen_) {
      return NULL;
    }
    // TODO(panicker): Validate the filename here, and if the file can't be
    // resolved then insert a NULL in the cache.
    // If validation succeeds then pass in resolved filename, mtime &
    // file length (from statbuf) to the constructor.
    const Template* tpl = new Template(filename, strip, this);
    it = &(*parsed_template_cache_)[template_cache_key];
    *it = CachedTemplate(tpl, CachedTemplate::FILE_BASED);
    assert(it);
  }
  if (it->should_reload) {
    // check if the template has changed on disk or if a new template with the
    // same name has been added earlier in the search path:
    const string resolved = FindTemplateFilename(
        it->refcounted_tpl->tpl()->original_filename());
    FileStat statbuf;
    if (it->template_type == CachedTemplate::FILE_BASED &&
        (resolved != it->refcounted_tpl->tpl()->template_file() ||
         HasTemplateChangedOnDisk(
             it->refcounted_tpl->tpl()->template_file(),
             it->refcounted_tpl->tpl()->mtime(),
             &statbuf))) {
      // Create a new template, insert it into the cache under
      // template_cache_key, and DecRef() the old one to indicate
      // the cache no longer has a reference to it.
      const Template* tpl = new Template(filename, strip, this);
      // DecRef after creating the new template since DecRef may free up
      // the storage for filename,
      it->refcounted_tpl->DecRef();
      *it = CachedTemplate(tpl, CachedTemplate::FILE_BASED);
    }
    it->should_reload = false;
  }

  // If the state is TS_ERROR, we leave the state as is, but return
  // NULL.  We won't try to load the template file again until the
  // reload status is set to true by another call to ReloadAllIfChanged.
  return it->refcounted_tpl->tpl()->state() == TS_READY ? it->refcounted_tpl : NULL;
}